

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O0

void __thiscall
LASreadItemCompressed_BYTE14_v3::LASreadItemCompressed_BYTE14_v3
          (LASreadItemCompressed_BYTE14_v3 *this,ArithmeticDecoder *dec,U32 number,
          U32 decompress_selective)

{
  U32 *pUVar1;
  BOOL *pBVar2;
  uint local_34;
  uint local_30;
  U32 c;
  U32 i;
  U32 decompress_selective_local;
  U32 number_local;
  ArithmeticDecoder *dec_local;
  LASreadItemCompressed_BYTE14_v3 *this_local;
  
  LASreadItemCompressed::LASreadItemCompressed(&this->super_LASreadItemCompressed);
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_001b0318;
  if (dec == (ArithmeticDecoder *)0x0) {
    __assert_fail("dec",
                  "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v3.cpp"
                  ,0x83e,
                  "LASreadItemCompressed_BYTE14_v3::LASreadItemCompressed_BYTE14_v3(ArithmeticDecoder *, U32, const U32)"
                 );
  }
  this->dec = dec;
  if (number != 0) {
    this->number = number;
    this->instream_Bytes = (ByteStreamInArray **)0x0;
    this->dec_Bytes = (ArithmeticDecoder **)0x0;
    pUVar1 = (U32 *)operator_new__((ulong)number << 2);
    this->num_bytes_Bytes = pUVar1;
    pBVar2 = (BOOL *)operator_new__((ulong)number);
    this->changed_Bytes = pBVar2;
    pBVar2 = (BOOL *)operator_new__((ulong)number);
    this->requested_Bytes = pBVar2;
    for (local_30 = 0; local_30 < number; local_30 = local_30 + 1) {
      this->num_bytes_Bytes[local_30] = 0;
      this->changed_Bytes[local_30] = false;
      if (local_30 < 0x10) {
        this->requested_Bytes[local_30] =
             (decompress_selective & 0x10000 << ((byte)local_30 & 0x1f)) != 0;
      }
      else {
        this->requested_Bytes[local_30] = true;
      }
    }
    this->bytes = (U8 *)0x0;
    this->num_bytes_allocated = 0;
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      this->contexts[local_34].m_bytes = (ArithmeticModel **)0x0;
    }
    this->current_context = 0;
    return;
  }
  __assert_fail("number",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v3.cpp"
                ,0x843,
                "LASreadItemCompressed_BYTE14_v3::LASreadItemCompressed_BYTE14_v3(ArithmeticDecoder *, U32, const U32)"
               );
}

Assistant:

LASreadItemCompressed_BYTE14_v3::LASreadItemCompressed_BYTE14_v3(ArithmeticDecoder* dec, U32 number, const U32 decompress_selective)
{
  /* not used as a decoder. just gives access to instream */

  assert(dec);
  this->dec = dec;

  /* must be more than one byte */

  assert(number);
  this->number = number;

  /* zero instream and decoder pointer arrays */

  instream_Bytes = 0;

  dec_Bytes = 0;

  /* create and init num_bytes and booleans arrays */

  num_bytes_Bytes = new U32[number];

  changed_Bytes = new BOOL[number];

  requested_Bytes = new BOOL[number];

  U32 i;
  for (i = 0; i < number; i++)
  {
    num_bytes_Bytes[i] = 0;

    changed_Bytes[i] = FALSE;

    if (i > 15) // currently only the first 16 extra bytes can be selectively decompressed
    {
      requested_Bytes[i] = TRUE;
    }
    else
    {
      requested_Bytes[i] = (decompress_selective & (LASZIP_DECOMPRESS_SELECTIVE_BYTE0 << i) ? TRUE : FALSE);
    }
  }

  /* init the bytes buffer to zero */

  bytes = 0;
  num_bytes_allocated = 0;

  /* mark the four scanner channel contexts as uninitialized */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].m_bytes = 0;
  }
  current_context = 0;
}